

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O1

void irr::executeBlit_TextureCopy_x_to_x(SBlitJob *job)

{
  u32 uVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  u32 uVar9;
  void *pvVar10;
  float fVar11;
  float fVar12;
  
  if (job->stretch == true) {
    fVar11 = floorf((float)job->x_stretch * 262144.0 + 0.0);
    fVar12 = floorf((float)job->y_stretch * 262144.0 + 0.0);
    if (job->srcPixelMul == 2) {
      uVar1 = job->height;
      if (uVar1 != 0) {
        pvVar10 = job->src;
        pvVar3 = job->dst;
        iVar4 = job->srcPitch;
        uVar5 = job->width;
        uVar2 = job->dstPitch;
        iVar8 = 0;
        uVar9 = 0;
        do {
          if ((ulong)uVar5 != 0) {
            uVar6 = 0;
            iVar7 = 0;
            do {
              *(undefined2 *)((long)pvVar3 + uVar6 * 2) =
                   *(undefined2 *)
                    ((long)pvVar10 + (long)(iVar7 >> 0x12) * 2 + (long)(iVar8 >> 0x12) * (long)iVar4
                    );
              uVar6 = uVar6 + 1;
              iVar7 = iVar7 + (int)fVar11;
            } while (uVar5 != uVar6);
          }
          pvVar3 = (void *)((long)pvVar3 + (ulong)uVar2);
          uVar9 = uVar9 + 1;
          iVar8 = iVar8 + (int)fVar12;
        } while (uVar9 != uVar1);
      }
    }
    else if ((job->srcPixelMul == 4) && (job->height != 0)) {
      pvVar10 = job->src;
      pvVar3 = job->dst;
      iVar4 = 0;
      uVar5 = 0;
      do {
        if (job->width != 0) {
          iVar8 = job->srcPitch;
          uVar6 = 0;
          iVar7 = 0;
          do {
            *(undefined4 *)((long)pvVar3 + uVar6 * 4) =
                 *(undefined4 *)
                  ((long)pvVar10 + (long)(iVar7 >> 0x12) * 4 + (long)(iVar4 >> 0x12) * (long)iVar8);
            uVar6 = uVar6 + 1;
            iVar7 = iVar7 + (int)fVar11;
          } while (uVar6 < job->width);
        }
        pvVar3 = (void *)((long)pvVar3 + (ulong)job->dstPitch);
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + (int)fVar12;
      } while (uVar5 < job->height);
    }
  }
  else if (job->height != 0) {
    uVar1 = job->dstPixelMul;
    uVar9 = job->width;
    pvVar10 = job->src;
    pvVar3 = job->dst;
    uVar5 = 0;
    do {
      memcpy(pvVar3,pvVar10,(ulong)(uVar1 * uVar9));
      pvVar10 = (void *)((long)pvVar10 + (long)job->srcPitch);
      pvVar3 = (void *)((long)pvVar3 + (ulong)job->dstPitch);
      uVar5 = uVar5 + 1;
    } while (uVar5 < job->height);
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_x_to_x(const SBlitJob *job)
{
	if (job->stretch) {
		const f18 wscale = f32_to_f18(job->x_stretch);
		const f18 hscale = f32_to_f18(job->y_stretch);

		f18 src_y = f18_zero;

		if (job->srcPixelMul == 4) {
			const u32 *src = (u32 *)(job->src);
			u32 *dst = (u32 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u32 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u32 *)((u8 *)(dst) + job->dstPitch);
			}
		} else if (job->srcPixelMul == 2) {
			const u16 *src = (u16 *)(job->src);
			u16 *dst = (u16 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u16 *)((u8 *)(dst) + job->dstPitch);
			}
		}
	} else {
		const size_t widthPitch = job->width * job->dstPixelMul;
		const void *src = (void *)job->src;
		void *dst = (void *)job->dst;

		for (u32 dy = 0; dy < job->height; ++dy) {
			memcpy(dst, src, widthPitch);

			src = (void *)((u8 *)(src) + job->srcPitch);
			dst = (void *)((u8 *)(dst) + job->dstPitch);
		}
	}
}